

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O0

void __thiscall
vkt::sr::anon_unknown_0::ShaderMatrixInstance::setupUniforms
          (ShaderMatrixInstance *this,Vec4 *param_1)

{
  bool bVar1;
  int iVar2;
  ShaderInput *local_40;
  ShaderInput *in;
  deUint32 local_20;
  int inNdx;
  deUint32 uniformBinding;
  int numInputs;
  Vec4 *param_1_local;
  ShaderMatrixInstance *this_local;
  
  bVar1 = MatrixCaseUtils::isOperationBinary(this->m_op);
  iVar2 = 1;
  if (bVar1) {
    iVar2 = 2;
  }
  local_20 = 0;
  for (in._4_4_ = 0; in._4_4_ < iVar2; in._4_4_ = in._4_4_ + 1) {
    if (in._4_4_ < 1) {
      local_40 = &this->m_in0;
    }
    else {
      local_40 = &this->m_in1;
    }
    if (local_40->inputType == INPUTTYPE_UNIFORM) {
      switch(local_40->dataType) {
      case TYPE_FLOAT:
        ShaderRenderCaseInstance::addUniform
                  (&this->super_ShaderRenderCaseInstance,local_20,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,
                   4,(void *)((long)&sr::(anonymous_namespace)::s_constInFloat + (long)in._4_4_ * 4)
                  );
        break;
      case TYPE_FLOAT_VEC2:
        ShaderRenderCaseInstance::addUniform<tcu::Vector<float,2>>
                  (&this->super_ShaderRenderCaseInstance,local_20,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,
                   (Vector<float,_2> *)
                   (sr::(anonymous_namespace)::s_constInVec2 + (long)in._4_4_ * 8));
        break;
      case TYPE_FLOAT_VEC3:
        ShaderRenderCaseInstance::addUniform<tcu::Vector<float,3>>
                  (&this->super_ShaderRenderCaseInstance,local_20,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,
                   (Vector<float,_3> *)
                   (sr::(anonymous_namespace)::s_constInVec3 + (long)in._4_4_ * 0xc));
        break;
      case TYPE_FLOAT_VEC4:
        ShaderRenderCaseInstance::addUniform<tcu::Vector<float,4>>
                  (&this->super_ShaderRenderCaseInstance,local_20,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,
                   (Vector<float,_4> *)
                   (sr::(anonymous_namespace)::s_constInVec4 + (long)in._4_4_ * 0x10));
        break;
      case TYPE_FLOAT_MAT2:
        addMatrixUniform(this,local_20,local_40->dataType,
                         (float *)(sr::(anonymous_namespace)::s_constInMat2x2 +
                                  (long)in._4_4_ * 0x10));
        break;
      case TYPE_FLOAT_MAT2X3:
        addMatrixUniform(this,local_20,local_40->dataType,
                         (float *)(sr::(anonymous_namespace)::s_constInMat2x3 +
                                  (long)in._4_4_ * 0x18));
        break;
      case TYPE_FLOAT_MAT2X4:
        addMatrixUniform(this,local_20,local_40->dataType,
                         (float *)(sr::(anonymous_namespace)::s_constInMat2x4 +
                                  (long)in._4_4_ * 0x20));
        break;
      case TYPE_FLOAT_MAT3X2:
        addMatrixUniform(this,local_20,local_40->dataType,
                         (float *)(sr::(anonymous_namespace)::s_constInMat3x2 +
                                  (long)in._4_4_ * 0x18));
        break;
      case TYPE_FLOAT_MAT3:
        addMatrixUniform(this,local_20,local_40->dataType,
                         (float *)(sr::(anonymous_namespace)::s_constInMat3x3 +
                                  (long)in._4_4_ * 0x24));
        break;
      case TYPE_FLOAT_MAT3X4:
        addMatrixUniform(this,local_20,local_40->dataType,
                         (float *)(sr::(anonymous_namespace)::s_constInMat3x4 +
                                  (long)in._4_4_ * 0x30));
        break;
      case TYPE_FLOAT_MAT4X2:
        addMatrixUniform(this,local_20,local_40->dataType,
                         (float *)(sr::(anonymous_namespace)::s_constInMat4x2 +
                                  (long)in._4_4_ * 0x20));
        break;
      case TYPE_FLOAT_MAT4X3:
        addMatrixUniform(this,local_20,local_40->dataType,
                         (float *)(sr::(anonymous_namespace)::s_constInMat4x3 +
                                  (long)in._4_4_ * 0x30));
        break;
      case TYPE_FLOAT_MAT4:
        addMatrixUniform(this,local_20,local_40->dataType,
                         (float *)(sr::(anonymous_namespace)::s_constInMat4x4 +
                                  (long)in._4_4_ * 0x40));
      }
      local_20 = local_20 + 1;
    }
  }
  return;
}

Assistant:

void ShaderMatrixInstance::setupUniforms (const tcu::Vec4&)
{
	const int	numInputs		= isOperationBinary(m_op) ? 2 : 1;
	deUint32	uniformBinding	= 0;

	for (int inNdx = 0; inNdx < numInputs; inNdx++)
	{
		const ShaderInput& in = inNdx > 0 ? m_in1 : m_in0;

		if (in.inputType == INPUTTYPE_UNIFORM)
		{
			switch (in.dataType)
			{
				case TYPE_FLOAT:		addUniform(uniformBinding, vk::VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, sizeof(float), &s_constInFloat[inNdx]);					break;
				case TYPE_FLOAT_VEC2:	addUniform(uniformBinding, vk::VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, s_constInVec2[inNdx]);			break;
				case TYPE_FLOAT_VEC3:	addUniform(uniformBinding, vk::VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, s_constInVec3[inNdx]);			break;
				case TYPE_FLOAT_VEC4:	addUniform(uniformBinding, vk::VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, s_constInVec4[inNdx]);			break;
				// \note GLES3 supports transpose in matrix upload.
				case TYPE_FLOAT_MAT2:	addMatrixUniform(uniformBinding, in.dataType, s_constInMat2x2[inNdx]);	break;
				case TYPE_FLOAT_MAT2X3:	addMatrixUniform(uniformBinding, in.dataType, s_constInMat2x3[inNdx]);	break;
				case TYPE_FLOAT_MAT2X4:	addMatrixUniform(uniformBinding, in.dataType, s_constInMat2x4[inNdx]);	break;
				case TYPE_FLOAT_MAT3X2:	addMatrixUniform(uniformBinding, in.dataType, s_constInMat3x2[inNdx]);	break;
				case TYPE_FLOAT_MAT3:	addMatrixUniform(uniformBinding, in.dataType, s_constInMat3x3[inNdx]);	break;
				case TYPE_FLOAT_MAT3X4:	addMatrixUniform(uniformBinding, in.dataType, s_constInMat3x4[inNdx]);	break;
				case TYPE_FLOAT_MAT4X2:	addMatrixUniform(uniformBinding, in.dataType, s_constInMat4x2[inNdx]);	break;
				case TYPE_FLOAT_MAT4X3:	addMatrixUniform(uniformBinding, in.dataType, s_constInMat4x3[inNdx]);	break;
				case TYPE_FLOAT_MAT4:	addMatrixUniform(uniformBinding, in.dataType, s_constInMat4x4[inNdx]);	break;
				default:
					DE_ASSERT(false);
			}
			uniformBinding++;
		}
	}
}